

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_json_schema.c
# Opt level: O0

void jsons_print_when(lyout *out,lys_when *when,int *first)

{
  int *first_local;
  lys_when *when_local;
  lyout *out_local;
  
  if (when != (lys_when *)0x0) {
    jsons_print_text(out,"when","condition",when->cond,0,first);
    jsons_print_text(out,"description","text",when->dsc,1,(int *)0x0);
    jsons_print_text(out,"reference","text",when->ref,1,(int *)0x0);
    ly_print(out,"}");
  }
  return;
}

Assistant:

static void
jsons_print_when(struct lyout *out, const struct lys_when *when, int *first)
{
    if (!when) {
        return;
    }
    jsons_print_text(out, "when", "condition", when->cond, 0, first);
    jsons_print_text(out, "description", "text", when->dsc, 1, NULL);
    jsons_print_text(out, "reference", "text", when->ref, 1, NULL);
    ly_print(out, "}");
}